

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MirrorModifierData>
          (Structure *this,MirrorModifierData *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  MirrorModifierData *dest_local;
  Structure *this_local;
  
  ReadField<2,Assimp::Blender::ModifierData>(this,&dest->modifier,"modifier",db);
  ReadField<1,short>(this,&dest->axis,"axis",db);
  ReadField<1,short>(this,&dest->flag,"flag",db);
  ReadField<1,float>(this,&dest->tolerance,"tolerance",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,&dest->mirror_ob,"*mirror_ob",db,false);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<MirrorModifierData> (
    MirrorModifierData& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.modifier,"modifier",db);
    ReadField<ErrorPolicy_Igno>(dest.axis,"axis",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.tolerance,"tolerance",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mirror_ob,"*mirror_ob",db);

    db.reader->IncPtr(size);
}